

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.hpp
# Opt level: O2

format_segment<char> *
fmt::impl::parse_format_segment<char>
          (format_segment<char> *__return_storage_ptr__,char *format,integer arg_index)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  bool bVar3;
  byte bVar4;
  ushort uVar5;
  fmtflags fVar6;
  byte *pbVar7;
  uint uVar8;
  byte *pbVar9;
  bool bVar10;
  streamsize precision;
  streamsize width;
  integer index;
  byte *local_40;
  long local_38;
  long local_30;
  long local_28;
  
  __return_storage_ptr__->valid = false;
  __return_storage_ptr__->base = 0;
  __return_storage_ptr__->nof_args = 0;
  __return_storage_ptr__->beginp = (char *)0x0;
  __return_storage_ptr__->endp = (char *)0x0;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->endp + 6) = (undefined1  [16])0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->precision = 0;
  __return_storage_ptr__->value_index = -1;
  auVar1 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
  __return_storage_ptr__->width_index = auVar1._0_8_;
  __return_storage_ptr__->precision_index = auVar1._8_8_;
  __return_storage_ptr__->conversion = '\0';
  if (format == (char *)0x0) {
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->beginp = format;
  do {
    local_40 = (byte *)format;
    format = (char *)(local_40 + 1);
    bVar4 = *local_40;
    if (bVar4 == 0) break;
  } while (bVar4 != 0x25);
  __return_storage_ptr__->endp = (char *)local_40;
  if (bVar4 == 0) {
    __return_storage_ptr__->valid = true;
    return __return_storage_ptr__;
  }
  bVar4 = *format;
  if (bVar4 == 0) {
    return __return_storage_ptr__;
  }
  if (bVar4 != 0x25) {
    fVar6 = ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max);
    local_40 = (byte *)format;
    if ((byte)(bVar4 - 0x31) < 9) {
      bVar3 = parse_integer<char,long>((char **)&local_40,&local_30);
      if ((bVar3) && (*local_40 == 0x24)) {
        format = (char *)(local_40 + 1);
        __return_storage_ptr__->value_index = local_30 + -1;
      }
      uVar5 = __return_storage_ptr__->flags;
      fVar6 = __return_storage_ptr__->fmtflags;
      bVar4 = *format;
      local_40 = (byte *)format;
    }
    else {
      uVar5 = 0;
    }
    do {
      pbVar9 = local_40 + 1;
      switch(bVar4) {
      case 0x27:
        uVar5 = uVar5 | 0x2000;
        break;
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2c:
      case 0x2e:
      case 0x2f:
        goto switchD_00142f1e_caseD_28;
      case 0x2b:
        uVar5 = uVar5 | 0x40;
        fVar6 = fVar6 | _S_showpos;
        goto LAB_00142f58;
      case 0x2d:
        uVar5 = uVar5 | 0x800;
        fVar6 = fVar6 | _S_left;
LAB_00142f58:
        __return_storage_ptr__->flags = uVar5;
        __return_storage_ptr__->fmtflags = fVar6;
        goto LAB_00142f68;
      case 0x30:
        uVar5 = uVar5 | 0x400;
        break;
      default:
        if (bVar4 != 0x20) {
          if (bVar4 == 0x23) {
            uVar5 = uVar5 | 0x1000;
            fVar6 = fVar6 | (_S_showpoint|_S_showbase);
            goto LAB_00142f58;
          }
          goto switchD_00142f1e_caseD_28;
        }
        uVar5 = uVar5 | 0x20;
      }
      __return_storage_ptr__->flags = uVar5;
LAB_00142f68:
      bVar4 = *pbVar9;
      local_40 = pbVar9;
    } while( true );
  }
  __return_storage_ptr__->valid = true;
  __return_storage_ptr__->endp = format;
  local_40 = local_40 + 2;
  goto LAB_0014326b;
switchD_00142f1e_caseD_28:
  bVar3 = (~uVar5 & 0xc00) != 0;
  uVar2 = uVar5 & 0xfbff;
  if (bVar3) {
    uVar2 = uVar5;
  }
  bVar10 = (~uVar2 & 0x60) != 0;
  uVar5 = uVar2 & 0xffdf;
  if (bVar10) {
    uVar5 = uVar2;
  }
  if (!bVar10 || !bVar3) {
    __return_storage_ptr__->flags = uVar5;
  }
  local_30 = 0;
  if (bVar4 == 0x2a) {
    __return_storage_ptr__->flags = uVar5 | 0x80;
    bVar4 = *pbVar9;
    if ((byte)(bVar4 - 0x31) < 9) {
      local_40 = pbVar9;
      bVar3 = parse_integer<char,long>((char **)&local_40,&local_38);
      if (!bVar3) {
        return __return_storage_ptr__;
      }
      if (*local_40 != 0x24) {
        return __return_storage_ptr__;
      }
      pbVar9 = local_40 + 1;
      bVar4 = local_40[1];
      __return_storage_ptr__->width_index = local_38 + -1;
      uVar5 = __return_storage_ptr__->nof_args;
    }
    else {
      uVar5 = __return_storage_ptr__->nof_args;
      __return_storage_ptr__->width_index = (ulong)uVar5 + arg_index;
    }
    __return_storage_ptr__->nof_args = uVar5 + 1;
  }
  else {
    bVar3 = parse_integer<char,long>((char **)&local_40,&local_30);
    if (!bVar3) {
      return __return_storage_ptr__;
    }
    bVar4 = *local_40;
    __return_storage_ptr__->width = local_30;
    pbVar9 = local_40;
  }
  local_40 = pbVar9;
  if (bVar4 == 0x2e) {
    local_40 = pbVar9 + 1;
    uVar5 = (ushort)*(undefined4 *)&__return_storage_ptr__->flags;
    __return_storage_ptr__->flags = uVar5 | 0x100;
    bVar4 = pbVar9[1];
    local_38 = 0;
    if (bVar4 == 0x2a) {
      pbVar7 = pbVar9 + 2;
      __return_storage_ptr__->flags = uVar5 | 0x300;
      bVar4 = pbVar9[2];
      if ((byte)(bVar4 - 0x31) < 9) {
        local_40 = pbVar7;
        bVar3 = parse_integer<char,long>((char **)&local_40,&local_28);
        if (!bVar3) {
          return __return_storage_ptr__;
        }
        if (*local_40 != 0x24) {
          return __return_storage_ptr__;
        }
        pbVar7 = local_40 + 1;
        bVar4 = local_40[1];
        __return_storage_ptr__->precision_index = local_28 + -1;
        uVar5 = __return_storage_ptr__->nof_args;
      }
      else {
        uVar5 = __return_storage_ptr__->nof_args;
        __return_storage_ptr__->precision_index = (ulong)uVar5 + arg_index;
      }
      __return_storage_ptr__->nof_args = uVar5 + 1;
      local_40 = pbVar7;
    }
    else {
      if ((byte)(bVar4 - 0x30) < 10) {
        bVar3 = parse_integer<char,long>((char **)&local_40,&local_38);
        if (!bVar3) {
          return __return_storage_ptr__;
        }
        bVar4 = *local_40;
      }
      else {
        local_38 = 0;
      }
      __return_storage_ptr__->precision = local_38;
    }
    if ((*(uint *)&__return_storage_ptr__->flags >> 10 & 1) != 0) {
      __return_storage_ptr__->flags = (ushort)*(uint *)&__return_storage_ptr__->flags & 0xfbff;
    }
  }
  while( true ) {
    local_40 = local_40 + 1;
    uVar8 = bVar4 - 0x4c;
    if ((0x2e < uVar8) || ((0x410150000001U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) break;
    bVar4 = *local_40;
  }
  __return_storage_ptr__->conversion = bVar4;
  switch((uint)bVar4) {
  case 0x58:
    pbVar9 = (byte *)((long)&__return_storage_ptr__->fmtflags + 1);
    *pbVar9 = *pbVar9 | 0x40;
  case 0x78:
    *(byte *)&__return_storage_ptr__->flags = (byte)__return_storage_ptr__->flags | 4;
LAB_00143203:
    __return_storage_ptr__->base = 0x10;
    break;
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
    goto switchD_00143184_caseD_59;
  case 0x61:
    __return_storage_ptr__->fmtflags = __return_storage_ptr__->fmtflags | _S_floatfield;
    goto LAB_00143203;
  case 99:
switchD_00143184_caseD_63:
    *(byte *)&__return_storage_ptr__->flags = (byte)__return_storage_ptr__->flags | 2;
    break;
  case 100:
  case 0x69:
    goto switchD_00143184_caseD_64;
  case 0x65:
    pbVar9 = (byte *)((long)&__return_storage_ptr__->fmtflags + 1);
    *pbVar9 = *pbVar9 | 1;
    goto switchD_00143184_caseD_67;
  case 0x66:
    *(undefined1 *)&__return_storage_ptr__->fmtflags =
         (char)__return_storage_ptr__->fmtflags | _S_fixed;
  case 0x67:
    goto switchD_00143184_caseD_67;
  case 0x6e:
    break;
  case 0x6f:
    *(byte *)&__return_storage_ptr__->flags = (byte)__return_storage_ptr__->flags | 4;
    __return_storage_ptr__->base = 8;
    break;
  case 0x70:
    __return_storage_ptr__->base = 0x10;
    *(byte *)&__return_storage_ptr__->flags = (byte)__return_storage_ptr__->flags | 1;
    break;
  case 0x73:
switchD_00143184_caseD_73:
    *(undefined1 *)&__return_storage_ptr__->fmtflags =
         (char)__return_storage_ptr__->fmtflags | _S_boolalpha;
    break;
  case 0x75:
    *(byte *)&__return_storage_ptr__->flags = (byte)__return_storage_ptr__->flags | 8;
switchD_00143184_caseD_64:
    *(byte *)&__return_storage_ptr__->flags = (byte)__return_storage_ptr__->flags | 4;
    goto switchD_00143184_caseD_67;
  default:
    switch(bVar4) {
    case 0x41:
      __return_storage_ptr__->fmtflags =
           __return_storage_ptr__->fmtflags | (_S_uppercase|_S_floatfield);
      *(byte *)&__return_storage_ptr__->flags = (byte)__return_storage_ptr__->flags | 0x10;
      goto LAB_00143203;
    case 0x42:
    case 0x44:
      goto switchD_00143184_caseD_59;
    case 0x43:
      goto switchD_00143184_caseD_63;
    case 0x45:
      pbVar9 = (byte *)((long)&__return_storage_ptr__->fmtflags + 1);
      *pbVar9 = *pbVar9 | 0x41;
      break;
    case 0x46:
      __return_storage_ptr__->fmtflags = __return_storage_ptr__->fmtflags | (_S_uppercase|_S_fixed);
      break;
    case 0x47:
      pbVar9 = (byte *)((long)&__return_storage_ptr__->fmtflags + 1);
      *pbVar9 = *pbVar9 | 0x40;
      break;
    default:
      if (bVar4 != 0x53) {
        return __return_storage_ptr__;
      }
      goto switchD_00143184_caseD_73;
    }
    *(byte *)&__return_storage_ptr__->flags = (byte)__return_storage_ptr__->flags | 0x10;
switchD_00143184_caseD_67:
    __return_storage_ptr__->base = 10;
  }
  if (((*(uint *)&__return_storage_ptr__->flags >> 0xd & 1) != 0) &&
     (__return_storage_ptr__->base != 10)) {
    __return_storage_ptr__->flags = (ushort)*(uint *)&__return_storage_ptr__->flags & 0xdfff;
  }
  __return_storage_ptr__->valid = true;
  if (__return_storage_ptr__->value_index < 0) {
    __return_storage_ptr__->value_index = arg_index + (ulong)__return_storage_ptr__->nof_args;
  }
  __return_storage_ptr__->nof_args = __return_storage_ptr__->nof_args + 1;
  if (*local_40 != 0) {
LAB_0014326b:
    __return_storage_ptr__->nextp = (char *)local_40;
  }
switchD_00143184_caseD_59:
  return __return_storage_ptr__;
}

Assistant:

inline format_segment<CharT>
parse_format_segment(const CharT* format, integer arg_index) {
   format_segment<CharT> result;
   if (!format) return result;

   /* skip everything until we encounter a placeholder
      or the end of the format string */
   result.beginp = format;
   CharT ch = *format;
   while (ch && ch != '%') {
      ch = *++format;
   }
   result.endp = format;

   /* end of format string reached? */
   if (!ch) {
      result.valid = true;
      return result;
   }

   ch = *++format;
   if (!ch) return result; /* format ends with '%' */

   /* process %% */
   if (ch == '%') {
      result.valid = true;
      ++result.endp; /* include first '%' */
      result.nextp = format+1;
      return result;
   }

   /* check if we have an argument index */
   if (ch >= '1' && ch <= '9') {
      const CharT* begin = format;
      integer index;
      if (parse_integer(format, index) && *format == '$') {
	 /* accept argument index */
	 result.value_index = index - 1;
	 ch = *++format;
      } else {
	 /* reset parsing */
	 format = begin; ch = *format;
      }
   }

   /* process conversion flags */
   while (ch == '\'' || ch == '-' || ch == '0' || ch == '+' ||
	 ch == ' ' || ch == '#') {
      switch (ch) {
	 case '\'':
	    result.flags |= grouping_flag;
	    break;
	 case '-':
	    result.flags |= minus_flag;
	    result.fmtflags |= std::ios_base::left;
	    break;
	 case '0': result.flags |= zero_fill; break;
	 case '+':
	    result.flags |= plus_flag;
	    result.fmtflags |= std::ios_base::showpos;
	    break;
	 case ' ': result.flags |= space_flag; break;
	 case '#':
	    result.flags |= special_flag;
	    result.fmtflags |= (std::ios_base::showbase |
	       std::ios_base::showpoint);
	    break;
      }
      ch = *++format;
   }

   if ((result.flags & minus_flag) && (result.flags & zero_fill)) {
      /* if the 0 and - flags both appear, the 0 flag is ignored */
      result.flags &= ~zero_fill;
   }
   if ((result.flags & plus_flag) && (result.flags & space_flag)) {
      /* if the ' ' and '+' flags both appear,
	 the <space> flag shall be ignored */
      result.flags &= ~space_flag;
   }
   /* minimum field width */
   std::streamsize width = 0;
   if (ch == '*') {
      result.flags |= dyn_width; ch = *++format;
      if (ch >= '1' && ch <= '9') {
	 integer index;
	 if (!parse_integer(format, index) || *format != '$') return result;
	 ch = *++format;
	 result.width_index = index - 1;
      } else {
	 result.width_index = arg_index + result.nof_args;
      }
      result.nof_args++;
   } else {
      if (!parse_integer(format, width)) return result;
      ch = *format;
      result.width = width;
   }
   /* precision */
   if (ch == '.') {
      result.flags |= precision;
      ch = *++format;
      std::streamsize precision = 0;
      if (ch == '*') {
	 result.flags |= dyn_precision; ch = *++format;
	 if (ch >= '1' && ch <= '9') {
	    integer index;
	    if (!parse_integer(format, index) || *format != '$') return result;
	    ch = *++format;
	    result.precision_index = index - 1;
	 } else {
	    result.precision_index = arg_index + result.nof_args;
	 }
	 result.nof_args++;
      } else {
	 if (ch >= '0' && ch <= '9') {
	    if (!parse_integer(format, precision)) return result;
	    ch = *format;
	 }
	 result.precision = precision;
      }
      if (result.flags & zero_fill) {
	 /* if a precision is specified, the 0 flag is ignored */
	 result.flags &= ~zero_fill;
      }
   }
   /* skip size specification */
   while (ch == 'l' || ch == 'L' || ch == 'h' ||
	 ch == 'j' || ch == 'z' || ch == 't') {
      ch = *++format;
   }
   /* conversion operation */
   result.conversion = ch;
   switch (ch) {
      case 'u':
	 result.flags |= is_unsigned;
	 FMT_PRINTF_FALLTHROUGH
      case 'd':
      case 'i':
	 result.flags |= is_integer;
	 result.base = 10;
	 break;
      case 'o':
	 result.flags |= is_integer;
	 result.base = 8;
	 break;
      case 'x':
	 result.flags |= is_integer;
	 result.base = 16;
	 break;
      case 'X':
	 result.fmtflags |= std::ios_base::uppercase;
	 result.flags |= is_integer;
	 result.base = 16;
	 break;
      case 'f':
	 result.fmtflags |= std::ios_base::fixed;
	 result.base = 10;
	 break;
      case 'F':
	 result.fmtflags |= (std::ios_base::fixed | std::ios_base::uppercase);
	 result.flags |= toupper;
	 result.base = 10;
	 break;
      case 'e':
	 result.fmtflags |= std::ios_base::scientific;
	 result.base = 10;
	 break;
      case 'E':
	 result.fmtflags |=
	    std::ios_base::scientific | std::ios_base::uppercase;
	 result.flags |= toupper;
	 result.base = 10;
	 break;
      case 'g':
	 /* default behaviour */
	 result.base = 10;
	 break;
      case 'G':
	 result.fmtflags |= std::ios_base::uppercase;
	 result.flags |= toupper;
	 result.base = 10;
	 break;
      case 'a':
	 result.fmtflags |= std::ios_base::scientific | std::ios_base::fixed;
	 result.base = 16;
	 break;
      case 'A':
	 result.fmtflags |= std::ios_base::scientific |
	    std::ios_base::fixed | std::ios_base::uppercase;
	 result.flags |= toupper;
	 result.base = 16;
	 break;
      case 'p':
	 result.base = 16;
	 result.flags |= is_pointer;
	 break;
      case 'C':
	 /* POSIX extension, equivalent to 'lc' */
      case 'c':
	 result.flags |= is_charval;
	 break;
      case 'S':
	 /* POSIX extension, equivalent to 'ls' */
      case 's':
	 /* when boolean values are printed with %s, we get
	    more readable results; idea taken from N3506 */
	 result.fmtflags |= std::ios_base::boolalpha;
	 break;
      case 'n':
	 /* nothing to be done here */
	 break;
      default:
	 return result;
   }
   if ((result.flags & grouping_flag) && (result.base != 10)) {
      /* grouping is just supported for %i, %d, %u, %f, %F,
         %g, and %G, i.e. all cases with base == 10 */
      result.flags &= ~grouping_flag;
   }
   result.valid = true;
   if (result.value_index < 0) {
      result.value_index = arg_index + result.nof_args;
   }
   result.nof_args++;
   ch = *++format;
   if (ch) {
      result.nextp = format;
   }
   return result;
}